

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v8::detail::
         write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>
                   (appender out,decimal_fp<float> *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,char decimal_point)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  appender aVar6;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar7;
  uint uVar8;
  char cVar9;
  size_t size;
  long lVar11;
  undefined7 in_register_00000081;
  uint uVar12;
  ulong uVar13;
  char local_be;
  bool pointy;
  int num_zeros;
  basic_format_specs<char> *local_b8;
  sign_t sign;
  int significand_size;
  significand_type significand;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_a0;
  int local_98;
  uint local_94;
  significand_type local_90;
  int exp;
  ulong local_88;
  float_specs fspecs_local;
  anon_class_28_7_94dcc806 write;
  undefined4 uStack_5c;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  ulong uVar10;
  
  local_94 = (uint)CONCAT71(in_register_00000081,decimal_point);
  significand = fp->significand;
  local_be = decimal_point;
  local_b8 = specs;
  local_a0 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  local_90 = significand;
  fspecs_local = fspecs;
  iVar4 = get_significand_size<float>(fp);
  uVar2 = fspecs._4_4_;
  sign = uVar2 >> 8 & 0xff;
  uVar13 = (ulong)((uint)(sign != none) + iVar4);
  local_88 = (ulong)(uint)fp->exponent;
  local_98 = fp->exponent + iVar4 + -1;
  significand_size = iVar4;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_98;
  bVar3 = write_float<fmt::v8::appender,_fmt::v8::detail::dragonbox::decimal_fp<float>,_char>::
          anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  uVar12 = fspecs.precision;
  if (bVar3) {
    if ((uVar2 >> 0x14 & 1) == 0) {
      uVar5 = 0;
      uVar10 = (ulong)(local_94 & 0xff);
      if (iVar4 == 1) {
        uVar10 = uVar5;
      }
      cVar9 = (char)uVar10;
    }
    else {
      uVar5 = 0;
      if (0 < (int)(uVar12 - iVar4)) {
        uVar5 = (ulong)(uVar12 - iVar4);
      }
      uVar13 = uVar13 + uVar5;
      cVar9 = (char)local_94;
    }
    write._0_8_ = CONCAT44(local_90,uVar2 >> 8) & 0xffffffff000000ff;
    write.decimal_point = cVar9;
    write.significand_size = iVar4;
    write._16_8_ = CONCAT35(write._21_3_,CONCAT14(((uVar2 >> 0x10 & 1) == 0) << 5,(int)uVar5)) |
                   0x4500000000;
    stack0xffffffffffffffa0 = (decimal_fp<float> *)CONCAT44(uStack_5c,local_98);
    if (0 < local_b8->width) {
      iVar4 = (int)local_88 + iVar4;
      iVar1 = local_98;
      if (iVar4 < 1) {
        iVar1 = 1 - iVar4;
      }
      lVar11 = 2;
      if (99 < iVar1) {
        lVar11 = (ulong)(999 < iVar1) + 3;
      }
      aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_1_&>
                        ((appender)local_a0.container,local_b8,
                         uVar13 + (3 - (ulong)(cVar9 == '\0')) + lVar11,&write);
      return (appender)
             aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
    }
    aVar6 = write_float<fmt::v8::appender,_fmt::v8::detail::dragonbox::decimal_fp<float>,_char>::
            anon_class_28_7_94dcc806::operator()(&write,(iterator)local_a0.container);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  iVar1 = fp->exponent;
  exp = iVar1 + iVar4;
  if (-1 < (long)iVar1) {
    size = (long)iVar1 + uVar13;
    num_zeros = uVar12 - exp;
    uVar13 = (ulong)(uint)num_zeros;
    if ((uVar2 >> 0x14 & 1) != 0) {
      if (fspecs._4_1_ == '\x02' || 0 < num_zeros) {
        if (num_zeros < 1) goto LAB_00111a68;
      }
      else {
        num_zeros = 1;
        uVar13 = 1;
      }
      size = size + uVar13 + 1;
    }
LAB_00111a68:
    write._0_8_ = &sign;
    write._8_8_ = &significand;
    write._16_8_ = &significand_size;
    unique0x100002b3 = fp;
    aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_2_>
                      ((appender)local_a0.container,local_b8,size,(anon_class_56_7_a2a26a24 *)&write
                      );
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  if (0 < exp) {
    num_zeros = uVar12 - iVar4 & (int)(uVar2 << 0xb) >> 0x1f;
    uVar2 = num_zeros;
    if (num_zeros < 1) {
      uVar2 = 0;
    }
    write._0_8_ = &sign;
    write._8_8_ = &significand;
    write._16_8_ = &significand_size;
    unique0x00004e80 = (decimal_fp<float> *)&exp;
    aVar6 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_3_>
                      ((appender)local_a0.container,local_b8,(ulong)uVar2 + 1 + uVar13,
                       (anon_class_48_6_48d028d1 *)&write);
    return (appender)
           aVar6.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  uVar8 = -exp;
  num_zeros = uVar8;
  if (uVar12 < uVar8) {
    num_zeros = uVar12;
  }
  if ((int)uVar12 < 0) {
    num_zeros = uVar8;
  }
  if (iVar4 != 0) {
    num_zeros = uVar8;
  }
  if (iVar4 == 0 && num_zeros == 0) {
    pointy = SUB41((uVar2 & 0x100000) >> 0x14,0);
    if (((ulong)fspecs & 0x10000000000000) == 0) {
      iVar4 = 1;
      goto LAB_00111b0c;
    }
  }
  else {
    pointy = true;
  }
  iVar4 = 2;
LAB_00111b0c:
  write._0_8_ = &sign;
  write._8_8_ = &pointy;
  write._16_8_ = &local_be;
  unique0x00004e80 = (decimal_fp<float> *)&num_zeros;
  bVar7.container =
       (buffer<char> *)
       write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_4_>
                 (local_a0.container,local_b8,(uint)(iVar4 + num_zeros) + uVar13,
                  (anon_class_48_6_d9b5e731 *)&write);
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar7.container;
}

Assistant:

auto write_float(OutputIt out, const DecimalFP& fp,
                 const basic_format_specs<Char>& specs, float_specs fspecs,
                 Char decimal_point) -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = detail::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}